

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webrtc_vad.c
# Opt level: O1

int WebRtcVad_ValidRateAndFrameLength(int rate,size_t frame_length)

{
  long lVar1;
  ulong uVar2;
  
  lVar1 = 0;
  while (*(int *)((long)kValidRates + lVar1) != rate) {
    lVar1 = lVar1 + 4;
    if (lVar1 == 0x10) {
      return -1;
    }
  }
  uVar2 = 0;
  do {
    frame_length = frame_length + (long)(*(int *)((long)kValidRates + lVar1) / 1000) * -10;
    if (frame_length == 0) {
      return 0;
    }
    uVar2 = uVar2 + 10;
  } while (uVar2 < 0x15);
  return -1;
}

Assistant:

int WebRtcVad_ValidRateAndFrameLength(int rate, size_t frame_length) {
  int return_value = -1;
  size_t i;
  int valid_length_ms;
  size_t valid_length;

  // We only allow 10, 20 or 30 ms frames. Loop through valid frame rates and
  // see if we have a matching pair.
  for (i = 0; i < kRatesSize; i++) {
    if (kValidRates[i] == rate) {
      for (valid_length_ms = 10; valid_length_ms <= kMaxFrameLengthMs;
          valid_length_ms += 10) {
        valid_length = (size_t)(kValidRates[i] / 1000 * valid_length_ms);
        if (frame_length == valid_length) {
          return_value = 0;
          break;
        }
      }
      break;
    }
  }

  return return_value;
}